

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_ReverseIterator_Test<unsigned_long>::SparseArray_ReverseIterator_Test
          (SparseArray_ReverseIterator_Test<unsigned_long> *this)

{
  anon_unknown.dwarf_c17be::SparseArray<unsigned_long>::SparseArray
            (&this->super_SparseArray<unsigned_long>);
  (this->super_SparseArray<unsigned_long>).super_Test._vptr_Test = (_func_int **)&PTR__Test_00227580
  ;
  return;
}

Assistant:

TYPED_TEST (SparseArray, ReverseIterator) {
    auto arr =
        sparse_array<char const *, TypeParam>::make_unique ({{0, "zero"}, {2, "two"}, {4, "four"}});

    std::vector<std::string> actual;
    std::copy (arr->crbegin (), arr->crend (), std::back_inserter (actual));

    std::vector<std::string> const expected{"four", "two", "zero"};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}